

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O0

int mbedtls_ecdsa_genkey
              (mbedtls_ecdsa_context *ctx,mbedtls_ecp_group_id gid,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_ecp_group_id gid_local;
  mbedtls_ecdsa_context *ctx_local;
  
  ctx_local._4_4_ = mbedtls_ecp_group_load(&ctx->grp,gid);
  if (ctx_local._4_4_ == 0) {
    ctx_local._4_4_ = mbedtls_ecp_gen_keypair(&ctx->grp,&ctx->d,&ctx->Q,f_rng,p_rng);
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_ecdsa_genkey( mbedtls_ecdsa_context *ctx, mbedtls_ecp_group_id gid,
                  int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret = 0;
    ECDSA_VALIDATE_RET( ctx   != NULL );
    ECDSA_VALIDATE_RET( f_rng != NULL );

    ret = mbedtls_ecp_group_load( &ctx->grp, gid );
    if( ret != 0 )
        return( ret );

   return( mbedtls_ecp_gen_keypair( &ctx->grp, &ctx->d,
                                    &ctx->Q, f_rng, p_rng ) );
}